

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parg.c
# Opt level: O1

int parg_getopt_long(parg_state *ps,int argc,char **argv,char *optstring,parg_option *longopts,
                    int *longindex)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  char *pcVar6;
  
  if (ps == (parg_state *)0x0) {
    __assert_fail("ps != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/aras-p[P]sizer/src/parg.c",0xa2
                  ,
                  "int parg_getopt_long(struct parg_state *, int, char *const *, const char *, const struct parg_option *, int *)"
                 );
  }
  if (argv == (char **)0x0) {
    __assert_fail("argv != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/aras-p[P]sizer/src/parg.c",0xa3
                  ,
                  "int parg_getopt_long(struct parg_state *, int, char *const *, const char *, const struct parg_option *, int *)"
                 );
  }
  if (optstring == (char *)0x0) {
    __assert_fail("optstring != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/aras-p[P]sizer/src/parg.c",0xa4
                  ,
                  "int parg_getopt_long(struct parg_state *, int, char *const *, const char *, const struct parg_option *, int *)"
                 );
  }
  ps->optarg = (char *)0x0;
  if (argc < 2) {
    return -1;
  }
  if ((ps->nextchar == (char *)0x0) || (*ps->nextchar == '\0')) {
    iVar5 = ps->optind;
    if (argc <= iVar5) {
      return -1;
    }
    if (argv[iVar5] == (char *)0x0) {
      return -1;
    }
    ps->optind = iVar5 + 1;
    pcVar3 = argv[iVar5];
    ps->nextchar = pcVar3;
    if (*pcVar3 != '-') {
LAB_0010a4d9:
      ps->optarg = pcVar3;
      ps->nextchar = (char *)0x0;
      return 1;
    }
    if (pcVar3[1] == '-') {
      if (pcVar3[2] == '\0') {
        ps->nextchar = (char *)0x0;
        return -1;
      }
      if (longopts != (parg_option *)0x0) {
        ps->nextchar = pcVar3 + 2;
        iVar5 = match_long(ps,argc,argv,optstring,longopts,longindex);
        return iVar5;
      }
    }
    else if (pcVar3[1] == '\0') goto LAB_0010a4d9;
    ps->nextchar = pcVar3 + 1;
  }
  pcVar3 = ps->nextchar;
  pcVar6 = strchr(optstring,(int)*pcVar3);
  if (pcVar6 == (char *)0x0) {
    ps->nextchar = pcVar3 + 1;
    ps->optopt = (int)*pcVar3;
    return 0x3f;
  }
  pcVar1 = pcVar3 + 1;
  if (pcVar6[1] == ':') {
    if (*pcVar1 == '\0') {
      if (pcVar6[2] == ':') goto LAB_0010a509;
      iVar5 = ps->optind;
      if ((argc <= iVar5) || (pcVar4 = argv[iVar5], pcVar4 == (char *)0x0)) {
        ps->nextchar = pcVar1;
        ps->optopt = (int)*pcVar3;
        return (uint)(*optstring != ':') * 5 + 0x3a;
      }
      ps->optind = iVar5 + 1;
      ps->optarg = pcVar4;
    }
    else {
      ps->optarg = pcVar1;
    }
    ps->nextchar = (char *)0x0;
    cVar2 = *pcVar6;
  }
  else {
LAB_0010a509:
    ps->nextchar = pcVar1;
    cVar2 = *pcVar3;
  }
  return (int)cVar2;
}

Assistant:

int
parg_getopt_long(struct parg_state *ps, int argc, char *const argv[],
                 const char *optstring,
                 const struct parg_option *longopts, int *longindex)
{
	assert(ps != NULL);
	assert(argv != NULL);
	assert(optstring != NULL);

	ps->optarg = NULL;

	if (argc < 2) {
		return -1;
	}

	/* Advance to next element if needed */
	if (ps->nextchar == NULL || *ps->nextchar == '\0') {
		if (is_argv_end(ps, argc, argv)) {
			return -1;
		}

		ps->nextchar = argv[ps->optind++];

		/* Check for nonoption element (including '-') */
		if (ps->nextchar[0] != '-' || ps->nextchar[1] == '\0') {
			ps->optarg = ps->nextchar;
			ps->nextchar = NULL;
			return 1;
		}

		/* Check for '--' */
		if (ps->nextchar[1] == '-') {
			if (ps->nextchar[2] == '\0') {
				ps->nextchar = NULL;
				return -1;
			}

			if (longopts != NULL) {
				ps->nextchar += 2;

				return match_long(ps, argc, argv, optstring,
				                  longopts, longindex);
			}
		}

		ps->nextchar++;
	}

	/* Match nextchar */
	return match_short(ps, argc, argv, optstring);
}